

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DynamicallyLoadTracerTest.cpp
# Opt level: O0

int main(int argc,char **argv)

{
  char *shared_library;
  bool bVar1;
  ulong uVar2;
  ostream *poVar3;
  error_code local_88 [2];
  undefined4 local_68;
  undefined1 local_58 [8];
  expected<opentracing::v3::DynamicTracingLibraryHandle,_std::error_code> tracerFactoryMaybe;
  string errorMessage;
  char *library;
  char **argv_local;
  int argc_local;
  
  if (argc == 2) {
    shared_library = argv[1];
    std::__cxx11::string::string((string *)&tracerFactoryMaybe.contained.m_value.tracer_factory_);
    opentracing::v3::DynamicallyLoadTracingLibrary
              ((expected<opentracing::v3::DynamicTracingLibraryHandle,_std::error_code> *)local_58,
               shared_library,(string *)&tracerFactoryMaybe.contained.m_value.tracer_factory_);
    uVar2 = std::__cxx11::string::empty();
    if ((uVar2 & 1) == 0) {
      poVar3 = std::operator<<((ostream *)&std::cerr,"Failed to load tracing tracer: ");
      poVar3 = std::operator<<(poVar3,(string *)
                                      &tracerFactoryMaybe.contained.m_value.tracer_factory_);
      std::operator<<(poVar3,"\n");
      argv_local._4_4_ = -1;
    }
    else {
      bVar1 = opentracing::v3::expected::operator_cast_to_bool((expected *)local_58);
      if (bVar1) {
        argv_local._4_4_ = 0;
      }
      else {
        poVar3 = std::operator<<((ostream *)&std::cerr,"Failed to load tracing library: ");
        opentracing::v3::expected<opentracing::v3::DynamicTracingLibraryHandle,_std::error_code>::
        error((expected<opentracing::v3::DynamicTracingLibraryHandle,_std::error_code> *)local_58);
        std::error_code::message_abi_cxx11_(local_88);
        poVar3 = std::operator<<(poVar3,(string *)local_88);
        std::operator<<(poVar3,"\n");
        std::__cxx11::string::~string((string *)local_88);
        argv_local._4_4_ = -1;
      }
    }
    local_68 = 1;
    opentracing::v3::expected<opentracing::v3::DynamicTracingLibraryHandle,_std::error_code>::
    ~expected((expected<opentracing::v3::DynamicTracingLibraryHandle,_std::error_code> *)local_58);
    std::__cxx11::string::~string((string *)&tracerFactoryMaybe.contained.m_value.tracer_factory_);
  }
  else {
    std::operator<<((ostream *)&std::cerr,"DynamicLoadTest <tracer-library>\n");
    argv_local._4_4_ = -1;
  }
  return argv_local._4_4_;
}

Assistant:

int main(int argc, char* argv[])
{
    if (argc != 2) {
        std::cerr << "DynamicLoadTest <tracer-library>\n";
        return -1;
    }
    const char* library = argv[1];
    std::string errorMessage;
    auto tracerFactoryMaybe =
        opentracing::DynamicallyLoadTracingLibrary(library, errorMessage);
#ifdef JAEGERTRACING_WITH_YAML_CPP
    if (!errorMessage.empty()) {
        std::cerr << "Failed to load tracing tracer: " << errorMessage << "\n";
        return -1;
    }
    if (!tracerFactoryMaybe) {
        std::cerr << "Failed to load tracing library: "
                  << tracerFactoryMaybe.error().message() << "\n";
        return -1;
    }
#else
    if (tracerFactoryMaybe) {
        std::cerr << "Dynamically loading a tracing library should fail "
                     "without YAML support\n";
        return -1;
    }
#endif  // JAEGERTRACING_WITH_YAML_CPP
    return 0;
}